

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

void __thiscall IRT::CFrame::AddLocalAddress(CFrame *this,string *name)

{
  int _offset;
  CAddressInFrame *this_00;
  IAddress *_frameAddress;
  CAddressInFrame *address;
  string *name_local;
  CFrame *this_local;
  
  this_00 = (CAddressInFrame *)operator_new(0x18);
  _frameAddress = GetFramePointerAddress(this);
  _offset = nextOffsetFromFramePointer(this);
  CAddressInFrame::CAddressInFrame(this_00,_frameAddress,_offset);
  addAddress(this,name,(IAddress *)this_00);
  return;
}

Assistant:

void CFrame::AddLocalAddress(const std::string &name) {
    const CAddressInFrame *address = new CAddressInFrame(GetFramePointerAddress(), nextOffsetFromFramePointer());
    addAddress(name, address);
}